

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O3

void __thiscall CTPNNot::gen_code(CTPNNot *this,int discard,int param_2)

{
  CTcPrsNode *pCVar1;
  undefined4 in_register_00000034;
  
  pCVar1 = (this->super_CTPNNotBase).super_CTPNUnary.super_CTPNUnaryBase.sub_;
  (**(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)
            (pCVar1,CONCAT44(in_register_00000034,discard),1);
  if (discard != 0) {
    return;
  }
  CTcGenTarg::write_op(G_cg,',');
  return;
}

Assistant:

void CTPNNot::gen_code(int discard, int)
{
    /*
     *   Generate the subexpression and apply the NOT opcode.  Note that
     *   we can compute the subexpression as though we were applying a
     *   condition, because the NOT opcode takes exactly the same kind of
     *   input as any condition opcode; we can thus avoid an extra
     *   conversion in some cases.  
     */
    gen_unary(OPC_NOT, discard, TRUE);
}